

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPathShape.cpp
# Opt level: O1

void __thiscall
chrono::ChPathShape::ChPathShape(ChPathShape *this,shared_ptr<chrono::geometry::ChLinePath> *mpath)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  ChVisualShape::ChVisualShape(&this->super_ChVisualShape);
  (this->super_ChVisualShape)._vptr_ChVisualShape = (_func_int **)&PTR__ChPathShape_00b69a98;
  (this->gpath).super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  p_Var1 = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->gpath).super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->npoints = 200;
  return;
}

Assistant:

ChPathShape::ChPathShape(std::shared_ptr<geometry::ChLinePath>& mpath) : npoints(200), gpath(mpath) {}